

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestProgramStart(StreamingListener *this,UnitTest *param_1)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"event=TestProgramStart",&local_31);
  SendLn(this,&local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void OnTestProgramStart(const UnitTest& /* unit_test */) override {
    SendLn("event=TestProgramStart");
  }